

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::AcceptanceTests_Load_Test>::
~ParameterizedTestFactory
          (ParameterizedTestFactory<(anonymous_namespace)::AcceptanceTests_Load_Test> *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_TestFactoryBase)._vptr_TestFactoryBase =
       (_func_int **)&PTR__ParameterizedTestFactory_001a89d0;
  std::vector<(anonymous_namespace)::Assertion,_std::allocator<(anonymous_namespace)::Assertion>_>::
  ~vector(&(this->parameter_).assertions);
  pcVar1 = (this->parameter_).ccs._M_dataplus._M_p;
  paVar2 = &(this->parameter_).ccs.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->parameter_).name._M_dataplus._M_p;
  paVar2 = &(this->parameter_).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter) :
      parameter_(parameter) {}